

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

ParseArgumentStatus __thiscall
google::protobuf::compiler::CommandLineInterface::ParseArguments
          (CommandLineInterface *this,int argc,char **argv)

{
  pointer pOVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  __type _Var5;
  ParseArgumentStatus PVar6;
  ostream *poVar7;
  reference key;
  size_type sVar8;
  pointer pbVar9;
  LogMessage *this_00;
  _Alloc_hider b;
  pointer pbVar10;
  ParseArgumentStatus PVar11;
  long lVar12;
  char *pcVar13;
  CommandLineInterface *this_01;
  char *in_R9;
  OutputDirective *d;
  ulong uVar14;
  pointer pOVar15;
  string_view plugin_prefix;
  string_view directive;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  string name;
  string value;
  iterator local_70;
  iterator __begin2;
  string local_50;
  
  this_01 = this;
  std::__cxx11::string::assign((char *)this);
  arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (lVar12 = 1; lVar12 < argc; lVar12 = lVar12 + 1) {
    pcVar13 = argv[lVar12];
    if (*pcVar13 == '@') {
      bVar3 = ExpandArgumentFile(this_01,pcVar13 + 1,&arguments);
      if (!bVar3) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Failed to open argument file: ");
        poVar7 = std::operator<<(poVar7,argv[lVar12] + 1);
        std::endl<char,std::char_traits<char>>(poVar7);
        PVar11 = PARSE_ARGUMENT_FAIL;
        goto LAB_0019a036;
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,pcVar13,(allocator<char> *)&value);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arguments,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name);
      this_01 = (CommandLineInterface *)&name;
      std::__cxx11::string::~string((string *)&name);
    }
  }
  if (arguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      arguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    PrintHelpText(this);
    PVar11 = PARSE_ARGUMENT_DONE_AND_EXIT;
  }
  else {
    uVar14 = 0;
    PVar11 = PARSE_ARGUMENT_FAIL;
    do {
      if ((ulong)((long)arguments.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)arguments.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar14) {
        __begin2 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::begin((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&this->plugin_parameters_);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::AssertNotDebugCapacity
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&this->plugin_parameters_);
        local_70.ctrl_ = (ctrl_t *)0x0;
        bVar3 = false;
        while (bVar4 = absl::lts_20250127::container_internal::operator!=(&__begin2,&local_70),
              bVar4) {
          key = absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::iterator::operator*(&__begin2);
          name._0_16_ = absl::lts_20250127::container_internal::
                        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        ::find<std::__cxx11::string>
                                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                    *)&this->plugins_,&key->first);
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::AssertNotDebugCapacity
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&this->plugins_);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = value._M_string_length;
          value._0_16_ = auVar2 << 0x40;
          bVar4 = absl::lts_20250127::container_internal::operator!=
                            ((iterator *)&name,(iterator *)&value);
          if (!bVar4) {
            pOVar1 = (this->output_directives_).
                     super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pOVar15 = (this->output_directives_).
                           super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                           ._M_impl.super__Vector_impl_data._M_start; pOVar15 != pOVar1;
                pOVar15 = pOVar15 + 1) {
              if (pOVar15->generator == (CodeGenerator *)0x0) {
                plugin_prefix._M_str = (char *)(pOVar15->name)._M_string_length;
                plugin_prefix._M_len = (size_t)(this->plugin_prefix_)._M_dataplus._M_p;
                directive._M_str = in_R9;
                directive._M_len = (size_t)(pOVar15->name)._M_dataplus._M_p;
                compiler::(anonymous_namespace)::PluginName_abi_cxx11_
                          (&name,(_anonymous_namespace_ *)(this->plugin_prefix_)._M_string_length,
                           plugin_prefix,directive);
                _Var5 = std::operator==(&name,&key->first);
                std::__cxx11::string::~string((string *)&name);
                if (_Var5) goto LAB_0019a266;
              }
            }
            b._M_p = (pointer)(this->plugin_prefix_)._M_string_length;
            name._M_string_length = (size_type)(this->plugin_prefix_)._M_dataplus._M_p;
            name._M_dataplus._M_p = b._M_p;
            value._0_16_ = absl::lts_20250127::NullSafeStringView("gen-cpp");
            absl::lts_20250127::StrCat_abi_cxx11_
                      (&local_50,(lts_20250127 *)&name,(AlphaNum *)&value,(AlphaNum *)b._M_p);
            bVar4 = std::operator!=(&key->first,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            if (bVar4) {
              poVar7 = std::operator<<((ostream *)&std::cerr,"Unknown flag: ");
              poVar7 = std::operator<<(poVar7,"--");
              std::__cxx11::string::substr((ulong)&name,(ulong)key);
              poVar7 = std::operator<<(poVar7,(string *)&name);
              poVar7 = std::operator<<(poVar7,"_opt");
              std::endl<char,std::char_traits<char>>(poVar7);
              std::__cxx11::string::~string((string *)&name);
              bVar3 = true;
            }
          }
LAB_0019a266:
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::iterator::operator++(&__begin2);
        }
        PVar11 = PARSE_ARGUMENT_FAIL;
        if (bVar3) break;
        if (((this->proto_path_).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (this->proto_path_).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           ((this->descriptor_set_in_names_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (this->descriptor_set_in_names_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[1],_const_char_(&)[2],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&name,(char (*) [1])0x34bf6c,(char (*) [2])0x3b285f);
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)&this->proto_path_,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&name);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&name);
        }
        switch(this->mode_) {
        case MODE_COMPILE:
          pbVar9 = (this->input_files_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar10 = (this->input_files_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (pbVar9 == pbVar10) {
LAB_0019a464:
            pcVar13 = "Missing input file.";
          }
          else if ((((this->output_directives_).
                     super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                     ._M_impl.super__Vector_impl_data._M_start ==
                     (this->output_directives_).
                     super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                     ._M_impl.super__Vector_impl_data._M_finish) &&
                   ((this->descriptor_set_out_name_)._M_string_length == 0)) &&
                  ((this->edition_defaults_out_name_)._M_string_length == 0)) {
            pcVar13 = "Missing output directives.";
          }
          else {
LAB_0019a4a9:
            if (this->deterministic_output_ == false) {
              if (((this->dependency_out_name_)._M_string_length == 0) ||
                 ((ulong)((long)pbVar10 - (long)pbVar9) < 0x21)) goto LAB_0019a3b3;
              pcVar13 = "Can only process one input file when using --dependency_out=FILE.";
            }
            else {
              pcVar13 = "Can only use --deterministic_output with --encode.";
            }
          }
          goto LAB_0019a4e1;
        case MODE_ENCODE:
        case MODE_PRINT:
switchD_0019a2fe_caseD_1:
          pbVar9 = (this->input_files_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar10 = (this->input_files_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if ((pbVar9 == pbVar10) &&
             ((this->descriptor_set_in_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (this->descriptor_set_in_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_0019a464;
          if ((this->dependency_out_name_)._M_string_length == 0) {
            if (this->mode_ != MODE_ENCODE) goto LAB_0019a4a9;
LAB_0019a3b3:
            sVar8 = (this->descriptor_set_out_name_)._M_string_length;
            if ((sVar8 == 0 & this->imports_in_descriptor_set_) == 1) {
              poVar7 = std::operator<<((ostream *)&std::cerr,
                                       "--include_imports only makes sense when combined with --descriptor_set_out."
                                      );
              std::endl<char,std::char_traits<char>>(poVar7);
              sVar8 = (this->descriptor_set_out_name_)._M_string_length;
            }
            if ((sVar8 == 0 & this->source_info_in_descriptor_set_) == 1) {
              poVar7 = std::operator<<((ostream *)&std::cerr,
                                       "--include_source_info only makes sense when combined with --descriptor_set_out."
                                      );
              std::endl<char,std::char_traits<char>>(poVar7);
              sVar8 = (this->descriptor_set_out_name_)._M_string_length;
            }
            PVar11 = PARSE_ARGUMENT_DONE_AND_CONTINUE;
            if ((this->retain_options_in_descriptor_set_ == true) && (sVar8 == 0)) {
              poVar7 = std::operator<<((ostream *)&std::cerr,
                                       "--retain_options only makes sense when combined with --descriptor_set_out."
                                      );
              std::endl<char,std::char_traits<char>>(poVar7);
            }
            goto LAB_0019a036;
          }
          break;
        case MODE_DECODE:
          if ((this->codec_type_)._M_string_length != 0) goto switchD_0019a2fe_caseD_1;
          pbVar9 = (this->input_files_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar13 = "When using --decode_raw, no input files should be given.";
          if ((pbVar9 != (this->input_files_).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) ||
             ((this->descriptor_set_in_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (this->descriptor_set_in_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_0019a4e1;
          pbVar10 = pbVar9;
          if ((this->dependency_out_name_)._M_string_length == 0) goto LAB_0019a4a9;
          break;
        default:
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&name,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                     ,0x777);
          this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<
                              ((LogMessage *)&name,(char (*) [18])"Unexpected mode: ");
          absl::lts_20250127::log_internal::LogMessage::
          operator<<<google::protobuf::compiler::CommandLineInterface::Mode,_0>
                    (this_00,&this->mode_);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&name);
        }
        pcVar13 = "Can only use --dependency_out=FILE when generating code.";
LAB_0019a4e1:
        poVar7 = std::operator<<((ostream *)&std::cerr,pcVar13);
        std::endl<char,std::char_traits<char>>(poVar7);
        break;
      }
      name._M_string_length = 0;
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name.field_2._M_local_buf[0] = '\0';
      value._M_string_length = 0;
      value._M_dataplus._M_p = (pointer)&value.field_2;
      value.field_2._M_local_buf[0] = '\0';
      bVar3 = ParseArgument(this_01,arguments.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus.
                                    _M_p,&name,&value);
      if (bVar3) {
        uVar14 = uVar14 + 1;
        if ((uVar14 != (long)arguments.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)arguments.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5) &&
           (*arguments.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p != '-')) {
          std::__cxx11::string::_M_assign((string *)&value);
          goto LAB_00199fc6;
        }
        poVar7 = std::operator<<((ostream *)&std::cerr,"Missing value for flag: ");
        poVar7 = std::operator<<(poVar7,(string *)&name);
        std::endl<char,std::char_traits<char>>(poVar7);
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&name,"--decode");
        if (bVar3) {
          poVar7 = std::operator<<((ostream *)&std::cerr,
                                   "To decode an unknown message, use --decode_raw.");
          std::endl<char,std::char_traits<char>>(poVar7);
        }
        bVar3 = false;
        PVar11 = PARSE_ARGUMENT_FAIL;
      }
      else {
LAB_00199fc6:
        PVar6 = InterpretArgument(this,&name,&value);
        bVar3 = PVar6 == PARSE_ARGUMENT_DONE_AND_CONTINUE;
        if (!bVar3) {
          PVar11 = PVar6;
        }
        uVar14 = uVar14 + 1;
      }
      std::__cxx11::string::~string((string *)&value);
      this_01 = (CommandLineInterface *)&name;
      std::__cxx11::string::~string((string *)&name);
    } while (bVar3);
  }
LAB_0019a036:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&arguments);
  return PVar11;
}

Assistant:

CommandLineInterface::ParseArgumentStatus CommandLineInterface::ParseArguments(
    int argc, const char* const argv[]) {
  executable_name_ = argv[0];

  std::vector<std::string> arguments;
  for (int i = 1; i < argc; ++i) {
    if (argv[i][0] == '@') {
      if (!ExpandArgumentFile(argv[i] + 1, &arguments)) {
        std::cerr << "Failed to open argument file: " << (argv[i] + 1)
                  << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }
      continue;
    }
    arguments.push_back(argv[i]);
  }

  // if no arguments are given, show help
  if (arguments.empty()) {
    PrintHelpText();
    return PARSE_ARGUMENT_DONE_AND_EXIT;  // Exit without running compiler.
  }

  // Iterate through all arguments and parse them.
  for (size_t i = 0; i < arguments.size(); ++i) {
    std::string name, value;

    if (ParseArgument(arguments[i].c_str(), &name, &value)) {
      // Returned true => Use the next argument as the flag value.
      if (i + 1 == arguments.size() || arguments[i + 1][0] == '-') {
        std::cerr << "Missing value for flag: " << name << std::endl;
        if (name == "--decode") {
          std::cerr << "To decode an unknown message, use --decode_raw."
                    << std::endl;
        }
        return PARSE_ARGUMENT_FAIL;
      } else {
        ++i;
        value = arguments[i];
      }
    }

    ParseArgumentStatus status = InterpretArgument(name, value);
    if (status != PARSE_ARGUMENT_DONE_AND_CONTINUE) return status;
  }

  // Make sure each plugin option has a matching plugin output.
  bool foundUnknownPluginOption = false;
  for (const auto& kv : plugin_parameters_) {
    if (plugins_.find(kv.first) != plugins_.end()) {
      continue;
    }
    bool foundImplicitPlugin = false;
    for (const auto& d : output_directives_) {
      if (d.generator == nullptr) {
        // Infers the plugin name from the plugin_prefix_ and output directive.
        std::string plugin_name = PluginName(plugin_prefix_, d.name);

        // Since plugin_parameters_ is also inferred from --xxx_opt, we check
        // that it actually matches the plugin name inferred from --xxx_out.
        if (plugin_name == kv.first) {
          foundImplicitPlugin = true;
          break;
        }
      }
    }

    // This is a special case for cc_plugin invocations that are only with
    // "--cpp_opt" but no "--cpp_out". In this case, "--cpp_opt" only serves
    // as passing the arguments to cc_plugins, and no C++ generator is required
    // to be present in the invocation. We didn't have to skip for C++ generator
    // previously because the C++ generator was built-in.
    if (!foundImplicitPlugin &&
        kv.first != absl::StrCat(plugin_prefix_, "gen-cpp")) {
      std::cerr << "Unknown flag: "
                // strip prefix + "gen-" and add back "_opt"
                << "--" << kv.first.substr(plugin_prefix_.size() + 4) << "_opt"
                << std::endl;
      foundUnknownPluginOption = true;
    }
  }
  if (foundUnknownPluginOption) {
    return PARSE_ARGUMENT_FAIL;
  }

  // The --proto_path & --descriptor_set_in flags both specify places to look
  // for proto files. If neither were given, use the current working directory.
  if (proto_path_.empty() && descriptor_set_in_names_.empty()) {
    // Don't use make_pair as the old/default standard library on Solaris
    // doesn't support it without explicit template parameters, which are
    // incompatible with C++0x's make_pair.
    proto_path_.push_back(std::pair<std::string, std::string>("", "."));
  }

  // Check error cases that span multiple flag values.
  bool missing_proto_definitions = false;
  switch (mode_) {
    case MODE_COMPILE:
      missing_proto_definitions = input_files_.empty();
      break;
    case MODE_DECODE:
      // Handle --decode_raw separately, since it requires that no proto
      // definitions are specified.
      if (codec_type_.empty()) {
        if (!input_files_.empty() || !descriptor_set_in_names_.empty()) {
          std::cerr
              << "When using --decode_raw, no input files should be given."
              << std::endl;
          return PARSE_ARGUMENT_FAIL;
        }
        missing_proto_definitions = false;
        break;  // only for --decode_raw
      }
      // --decode (not raw) is handled the same way as the rest of the modes.
      ABSL_FALLTHROUGH_INTENDED;
    case MODE_ENCODE:
    case MODE_PRINT:
      missing_proto_definitions =
          input_files_.empty() && descriptor_set_in_names_.empty();
      break;
    default:
      ABSL_LOG(FATAL) << "Unexpected mode: " << mode_;
  }
  if (missing_proto_definitions) {
    std::cerr << "Missing input file." << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ == MODE_COMPILE && output_directives_.empty() &&
      descriptor_set_out_name_.empty() && edition_defaults_out_name_.empty()) {
    std::cerr << "Missing output directives." << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ != MODE_COMPILE && !dependency_out_name_.empty()) {
    std::cerr << "Can only use --dependency_out=FILE when generating code."
              << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ != MODE_ENCODE && deterministic_output_) {
    std::cerr << "Can only use --deterministic_output with --encode."
              << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (!dependency_out_name_.empty() && input_files_.size() > 1) {
    std::cerr
        << "Can only process one input file when using --dependency_out=FILE."
        << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (imports_in_descriptor_set_ && descriptor_set_out_name_.empty()) {
    std::cerr << "--include_imports only makes sense when combined with "
                 "--descriptor_set_out."
              << std::endl;
  }
  if (source_info_in_descriptor_set_ && descriptor_set_out_name_.empty()) {
    std::cerr << "--include_source_info only makes sense when combined with "
                 "--descriptor_set_out."
              << std::endl;
  }
  if (retain_options_in_descriptor_set_ && descriptor_set_out_name_.empty()) {
    std::cerr << "--retain_options only makes sense when combined with "
                 "--descriptor_set_out."
              << std::endl;
  }

  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}